

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeriesInteractionType.hpp
# Opt level: O2

void __thiscall
OpenMD::InversePowerSeriesInteractionType::InversePowerSeriesInteractionType
          (InversePowerSeriesInteractionType *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *series)

{
  pointer __x;
  
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__InversePowerSeriesInteractionType_002c3fe0;
  (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__x = (series->
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
      __x != (series->
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->powers,&__x->first);
    std::vector<double,_std::allocator<double>_>::push_back(&this->coefficients,&__x->second);
  }
  NonBondedInteractionType::setInversePowerSeries(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

InversePowerSeriesInteractionType(
        std::vector<std::pair<int, RealType>> series) {
      powers.clear();
      coefficients.clear();

      std::vector<std::pair<int, RealType>>::iterator it;

      for (it = series.begin(); it != series.end(); ++it) {
        powers.push_back((*it).first);
        coefficients.push_back((*it).second);
      }

      setInversePowerSeries();
    }